

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::String&,char_const(&)[26],unsigned_long&>
          (String *__return_storage_ptr__,kj *this,String *params,char (*params_1) [26],
          unsigned_long *params_2)

{
  String *value;
  char (*value_00) [26];
  kj *this_00;
  unsigned_long *value_01;
  CappedArray<char,_26UL> local_70;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  char (*local_28) [26];
  unsigned_long *params_local_2;
  char (*params_local_1) [26];
  String *params_local;
  
  local_28 = params_1;
  params_local_2 = (unsigned_long *)params;
  params_local_1 = (char (*) [26])this;
  params_local = __return_storage_ptr__;
  value = fwd<kj::String&>((String *)this);
  local_38 = toCharSequence<kj::String&>(value);
  value_00 = ::const((char (*) [26])params_local_2);
  local_48 = toCharSequence<char_const(&)[26]>(value_00);
  this_00 = (kj *)fwd<unsigned_long&>((unsigned_long *)local_28);
  toCharSequence<unsigned_long&>(&local_70,this_00,value_01);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>>
            (__return_storage_ptr__,(_ *)&local_38,&local_48,(ArrayPtr<const_char> *)&local_70,
             (CappedArray<char,_26UL> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}